

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void * fs_create_savepoint(char *name,int name_length)

{
  char *pcVar1;
  Savepoint *this;
  ulong uVar2;
  allocator local_51;
  string local_50;
  Savepoint *local_20;
  Savepoint *pSavepoint;
  char *pcStack_10;
  int name_length_local;
  char *name_local;
  
  pSavepoint._4_4_ = name_length;
  pcStack_10 = name;
  this = (Savepoint *)operator_new(0x50);
  ser::Savepoint::Savepoint(this);
  pcVar1 = pcStack_10;
  uVar2 = (ulong)pSavepoint._4_4_;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,uVar2,&local_51);
  ser::Savepoint::Init(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return local_20;
}

Assistant:

void* fs_create_savepoint(const char* name, int name_length)
{
    Savepoint* pSavepoint = new Savepoint;
    pSavepoint->Init(std::string(name, name_length));
    return reinterpret_cast<void*>(pSavepoint);
}